

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void av1_extend_frame(uint8_t *data,int width,int height,int stride,int border_horz,int border_vert,
                     int highbd)

{
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  int in_R8D;
  uint16_t *unaff_retaddr;
  int in_stack_00000008;
  int width_00;
  
  width_00 = (int)((ulong)in_RDI >> 0x20);
  if (in_stack_00000008 == 0) {
    extend_frame_lowbd((uint8_t *)unaff_retaddr,width_00,(int)in_RDI,CONCAT44(in_ESI,in_EDX),in_ECX,
                       in_R8D);
  }
  else {
    extend_frame_highbd(unaff_retaddr,width_00,(int)in_RDI,CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D);
  }
  return;
}

Assistant:

void av1_extend_frame(uint8_t *data, int width, int height, int stride,
                      int border_horz, int border_vert, int highbd) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (highbd) {
    extend_frame_highbd(CONVERT_TO_SHORTPTR(data), width, height, stride,
                        border_horz, border_vert);
    return;
  }
#endif
  (void)highbd;
  extend_frame_lowbd(data, width, height, stride, border_horz, border_vert);
}